

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_BitMask.cpp
# Opt level: O1

void anon_unknown.dwarf_9d1c7::run(void)

{
  int iVar1;
  MyClass2 *pMVar2;
  EVP_PKEY_CTX *pEVar3;
  RefCount *parent;
  long extraout_RDX;
  long lVar4;
  long extraout_RDX_00;
  long lVar5;
  bool bVar6;
  WeakPtr<(anonymous_namespace)::IMyInterface> w_1;
  Ptr<(anonymous_namespace)::IMyInterface> p3;
  Ptr<(anonymous_namespace)::MyClass2> p;
  WeakPtr<(anonymous_namespace)::MyClass2> w;
  Ptr<(anonymous_namespace)::IMyInterface> local_98;
  Ptr<(anonymous_namespace)::MyClass2> local_88;
  Ptr<(anonymous_namespace)::MyClass2> local_78;
  WeakPtr<(anonymous_namespace)::MyClass2> local_68;
  Ptr<(anonymous_namespace)::IMyInterface> local_58;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  run_Buf();
  pEVar3 = (EVP_PKEY_CTX *)operator_new(0x18,(nothrow_t *)&std::nothrow);
  *(undefined8 *)(pEVar3 + 8) = 0;
  *(undefined4 *)(pEVar3 + 0x10) = 0;
  *(undefined4 *)(pEVar3 + 0x14) = 1;
  *(undefined ***)pEVar3 = &PTR__MyClass2_0014c4d8;
  puts("MyClass2::MyClass2 ()");
  *(code **)(pEVar3 + 8) = axl::mem::deallocate;
  local_78.m_p = (MyClass2 *)0x0;
  local_78.m_refCount = (RefCount *)0x0;
  axl::rc::Ptr<(anonymous_namespace)::MyClass2>::copy(&local_78,pEVar3,pEVar3);
  local_68.m_refCount = (RefCount *)0x0;
  if (local_78.m_refCount != (RefCount *)0x0) {
    LOCK();
    (local_78.m_refCount)->m_weakRefCount = (local_78.m_refCount)->m_weakRefCount + 1;
    UNLOCK();
    local_68.m_refCount = local_78.m_refCount;
  }
  local_68.m_p = local_78.m_p;
  axl::rc::Ptr<(anonymous_namespace)::MyClass2>::clear(&local_78);
  local_88.m_p = (MyClass2 *)0x0;
  local_88.m_refCount = (RefCount *)0x0;
  lVar4 = extraout_RDX;
  if (local_68.m_refCount != (RefCount *)0x0) {
    do {
      iVar1 = (local_68.m_refCount)->m_refCount;
      if ((long)iVar1 == 0) {
        lVar4 = 0;
        bVar6 = false;
      }
      else {
        lVar5 = (long)iVar1 + 1;
        LOCK();
        bVar6 = iVar1 == (local_68.m_refCount)->m_refCount;
        if (bVar6) {
          (local_68.m_refCount)->m_refCount = (int32_t)lVar5;
        }
        UNLOCK();
        if (bVar6) {
          lVar4 = lVar5;
        }
        bVar6 = !bVar6;
      }
    } while (bVar6);
    if (lVar4 != 0) {
      uStack_3c = local_68.m_refCount._4_4_;
      uStack_40 = local_68.m_refCount._0_4_;
      uStack_44 = local_68.m_p._4_4_;
      local_48 = local_68.m_p._0_4_;
      local_88.m_p = local_68.m_p;
      local_88.m_refCount = local_68.m_refCount;
    }
  }
  axl::rc::Ptr<(anonymous_namespace)::MyClass2>::copy
            (&local_78,(EVP_PKEY_CTX *)local_88.m_p,(EVP_PKEY_CTX *)local_88.m_refCount);
  axl::rc::Ptr<(anonymous_namespace)::MyClass2>::clear(&local_88);
  axl::rc::WeakPtr<(anonymous_namespace)::MyClass2>::~WeakPtr(&local_68);
  axl::rc::Ptr<(anonymous_namespace)::MyClass2>::clear(&local_78);
  local_78.m_p = (MyClass2 *)0x0;
  local_78.m_refCount = (RefCount *)0x0;
  local_68.m_p = (MyClass2 *)0x0;
  local_68.m_refCount = (RefCount *)0x0;
  local_88.m_p = (MyClass2 *)0x0;
  local_88.m_refCount = (RefCount *)0x0;
  parent = (RefCount *)operator_new(0x188,(nothrow_t *)&std::nothrow);
  parent->m_freeFunc = (FreeFunc *)0x0;
  parent->m_refCount = 0;
  parent->m_weakRefCount = 1;
  parent->_vptr_RefCount = (_func_int **)&PTR__MySuperContainer_0014c510;
  parent[1]._vptr_RefCount = (_func_int **)&PTR_getChild_0014c548;
  axl::rc::Child<(anonymous_namespace)::MyContainer,_0UL>::Child
            ((Child<(anonymous_namespace)::MyContainer,_0UL> *)&parent[1].m_freeFunc,parent);
  axl::rc::Child<(anonymous_namespace)::MyContainer,_0UL>::Child
            ((Child<(anonymous_namespace)::MyContainer,_0UL> *)(parent + 8),parent);
  parent[0xe].m_refCount = 0x168;
  parent[0xe].m_weakRefCount = 0;
  parent[0xf]._vptr_RefCount = (_func_int **)&PTR__RefCount_0014bff0;
  parent[0xf].m_freeFunc = (FreeFunc *)0x0;
  parent[0xf].m_refCount = 0;
  parent[0xf].m_weakRefCount = 1;
  parent[0x10]._vptr_RefCount = (_func_int **)&PTR_getChild_0014c710;
  puts("MyClass4::MyClass4 ()");
  parent[0xf]._vptr_RefCount = (_func_int **)&PTR__Box_0014c678;
  parent[0x10]._vptr_RefCount = (_func_int **)&PTR_getChild_0014c698;
  parent[0xf].m_freeFunc =
       axl::rc::Child<axl::rc::Box<(anonymous_namespace)::MyClass4>,_0UL>::weakReleaseParent;
  LOCK();
  parent->m_weakRefCount = parent->m_weakRefCount + 1;
  UNLOCK();
  LOCK();
  parent[0xf].m_refCount = parent[0xf].m_refCount + 1;
  UNLOCK();
  puts("MySuperContainer::MySuperContainer ()");
  parent->m_freeFunc = axl::mem::deallocate;
  local_98.m_p = (IMyInterface *)0x0;
  local_98.m_refCount = (RefCount *)0x0;
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::copy
            (&local_98,(EVP_PKEY_CTX *)(parent + 1),(EVP_PKEY_CTX *)parent);
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::copy
            ((Ptr<(anonymous_namespace)::IMyInterface> *)&local_78,(EVP_PKEY_CTX *)local_98.m_p,
             (EVP_PKEY_CTX *)local_98.m_refCount);
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::clear(&local_98);
  pMVar2 = local_78.m_p;
  (*((local_78.m_p)->super_RefCount)._vptr_RefCount[1])(local_78.m_p);
  (*(pMVar2->super_RefCount)._vptr_RefCount[2])(pMVar2);
  (**(pMVar2->super_RefCount)._vptr_RefCount)(&local_98,pMVar2,1);
  (**(code **)(*(long *)local_98.m_p + 8))();
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::clear(&local_98);
  (**(pMVar2->super_RefCount)._vptr_RefCount)(&local_98,pMVar2,1);
  (**(code **)(*(long *)local_98.m_p + 0x10))();
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::clear(&local_98);
  (**(pMVar2->super_RefCount)._vptr_RefCount)(&local_98,pMVar2,2);
  (**(code **)(*(long *)local_98.m_p + 8))();
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::clear(&local_98);
  (**(pMVar2->super_RefCount)._vptr_RefCount)(&local_98,pMVar2,2);
  (**(code **)(*(long *)local_98.m_p + 0x10))();
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::clear(&local_98);
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::clear
            ((Ptr<(anonymous_namespace)::IMyInterface> *)&local_78);
  pEVar3 = (EVP_PKEY_CTX *)operator_new(0x20,(nothrow_t *)&std::nothrow);
  *(undefined ***)pEVar3 = &PTR__RefCount_0014bff0;
  *(undefined8 *)(pEVar3 + 8) = 0;
  *(undefined4 *)(pEVar3 + 0x10) = 0;
  *(undefined4 *)(pEVar3 + 0x14) = 1;
  *(undefined ***)(pEVar3 + 0x18) = &PTR_getChild_0014c710;
  puts("MyClass4::MyClass4 ()");
  *(undefined ***)pEVar3 = &PTR__Box_0014c678;
  *(undefined ***)(pEVar3 + 0x18) = &PTR_getChild_0014c698;
  *(code **)(pEVar3 + 8) = axl::mem::deallocate;
  local_98.m_p = (IMyInterface *)0x0;
  local_98.m_refCount = (RefCount *)0x0;
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::copy(&local_98,pEVar3 + 0x18,pEVar3);
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::copy
            ((Ptr<(anonymous_namespace)::IMyInterface> *)&local_88,(EVP_PKEY_CTX *)local_98.m_p,
             (EVP_PKEY_CTX *)local_98.m_refCount);
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::clear(&local_98);
  local_98.m_refCount = (RefCount *)0x0;
  if (local_88.m_refCount != (RefCount *)0x0) {
    LOCK();
    (local_88.m_refCount)->m_weakRefCount = (local_88.m_refCount)->m_weakRefCount + 1;
    UNLOCK();
    local_98.m_refCount = local_88.m_refCount;
  }
  local_98.m_p = (IMyInterface *)local_88.m_p;
  (**(code **)(*(long *)local_88.m_p + 0x10))();
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::clear
            ((Ptr<(anonymous_namespace)::IMyInterface> *)&local_88);
  local_58.m_p = (IMyInterface *)0x0;
  local_58.m_refCount = (RefCount *)0x0;
  lVar4 = extraout_RDX_00;
  if (local_98.m_refCount != (RefCount *)0x0) {
    do {
      iVar1 = (local_98.m_refCount)->m_refCount;
      if ((long)iVar1 == 0) {
        lVar4 = 0;
        bVar6 = false;
      }
      else {
        lVar5 = (long)iVar1 + 1;
        LOCK();
        bVar6 = iVar1 == (local_98.m_refCount)->m_refCount;
        if (bVar6) {
          (local_98.m_refCount)->m_refCount = (int32_t)lVar5;
        }
        UNLOCK();
        if (bVar6) {
          lVar4 = lVar5;
        }
        bVar6 = !bVar6;
      }
    } while (bVar6);
    if (lVar4 != 0) {
      uStack_3c = local_98.m_refCount._4_4_;
      uStack_40 = local_98.m_refCount._0_4_;
      uStack_44 = local_98.m_p._4_4_;
      local_48 = local_98.m_p._0_4_;
      local_58.m_p = local_98.m_p;
      local_58.m_refCount = local_98.m_refCount;
    }
  }
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::copy
            ((Ptr<(anonymous_namespace)::IMyInterface> *)&local_78,(EVP_PKEY_CTX *)local_58.m_p,
             (EVP_PKEY_CTX *)local_58.m_refCount);
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::clear(&local_58);
  axl::rc::WeakPtr<(anonymous_namespace)::IMyInterface>::~WeakPtr
            ((WeakPtr<(anonymous_namespace)::IMyInterface> *)&local_98);
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::clear
            ((Ptr<(anonymous_namespace)::IMyInterface> *)&local_88);
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::clear
            ((Ptr<(anonymous_namespace)::IMyInterface> *)&local_68);
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::clear
            ((Ptr<(anonymous_namespace)::IMyInterface> *)&local_78);
  return;
}

Assistant:

void run() {
	uint64_t lo64[][2] = {
		{ 0,  0x0000000000000000LL },
		{ 4,  0x000000000000000fLL },
		{ 8,  0x00000000000000ffLL },
		{ 12, 0x0000000000000fffLL },
		{ 16, 0x000000000000ffffLL },
		{ 31, 0x000000007fffffffLL },
		{ 32, 0x00000000ffffffffLL },
		{ 52, 0x000fffffffffffffLL },
		{ 56, 0x00ffffffffffffffLL },
		{ 60, 0x0fffffffffffffffLL },
		{ 63, 0x7fffffffffffffffLL },
		{ 64, 0xffffffffffffffffLL },
	};

	for (size_t i = 0; i < countof(lo64); i++) {
		uint64_t shift = lo64[i][0];
		uint64_t expected = lo64[i][1];
		uint64_t result = sl::getLoBitmask64(shift);
		printf("getLoBitmask64(%llu): 0x%016llx\n", shift, result);
		TEST_ASSERT(result == expected);
	}

	uint64_t hi64[][2] = {
		{ 0,  0xffffffffffffffffLL },
		{ 4,  0xfffffffffffffff0LL },
		{ 8,  0xffffffffffffff00LL },
		{ 12, 0xfffffffffffff000LL },
		{ 16, 0xffffffffffff0000LL },
		{ 31, 0xffffffff80000000LL },
		{ 32, 0xffffffff00000000LL },
		{ 52, 0xfff0000000000000LL },
		{ 56, 0xff00000000000000LL },
		{ 60, 0xf000000000000000LL },
		{ 63, 0x8000000000000000LL },
		{ 64, 0x0000000000000000LL },
	};

	for (size_t i = 0; i < countof(hi64); i++) {
		uint64_t shift = hi64[i][0];
		uint64_t expected = hi64[i][1];
		uint64_t result = sl::getHiBitmask64(shift);
		printf("getHiBitmask64(%llu): 0x%016llx\n", shift, result);
		TEST_ASSERT(result == expected);
	}

	uint32_t lo32[][2] = {
		{ 0,  0x00000000 },
		{ 4,  0x0000000f },
		{ 8,  0x000000ff },
		{ 12, 0x00000fff },
		{ 16, 0x0000ffff },
		{ 31, 0x7fffffff },
		{ 32, 0xffffffff },
	};

	for (size_t i = 0; i < countof(lo32); i++) {
		uint32_t shift = lo32[i][0];
		uint32_t expected = lo32[i][1];
		uint32_t result = sl::getLoBitmask32(shift);
		printf("getLoBitmask32(%llu): 0x%08x\n", shift, result);
		TEST_ASSERT(result == expected);
	}

	uint32_t hi32[][2] = {
		{ 0,  0xffffffff },
		{ 4,  0xfffffff0 },
		{ 8,  0xffffff00 },
		{ 12, 0xfffff000 },
		{ 16, 0xffff0000 },
		{ 31, 0x80000000 },
		{ 32, 0x00000000 },
	};

	for (size_t i = 0; i < countof(hi32); i++) {
		uint64_t shift = hi32[i][0];
		uint64_t expected = hi32[i][1];
		uint64_t result = sl::getHiBitmask32(shift);
		printf("getHiBitmask32(%llu): 0x%08x\n", shift, result);
		TEST_ASSERT(result == expected);
	}

	uint16_t lo16[][2] = {
		{ 0,  0x0000 },
		{ 4,  0x000f },
		{ 8,  0x00ff },
		{ 12, 0x0fff },
		{ 16, 0xffff },
	};

	for (size_t i = 0; i < countof(lo16); i++) {
		uint16_t shift = lo16[i][0];
		uint16_t expected = lo16[i][1];
		uint16_t result = sl::getLoBitmask16(shift);
		printf("getLoBitmask16(%llu): 0x%08x\n", shift, result);
		TEST_ASSERT(result == expected);
	}

	uint16_t hi16[][2] = {
		{ 0,  0xffff },
		{ 4,  0xfff0 },
		{ 8,  0xff00 },
		{ 12, 0xf000 },
		{ 16, 0x0000 },
	};

	for (size_t i = 0; i < countof(hi16); i++) {
		uint64_t shift = hi16[i][0];
		uint64_t expected = hi16[i][1];
		uint64_t result = sl::getHiBitmask16(shift);
		printf("getHiBitmask16(%llu): 0x%08x\n", shift, result);
		TEST_ASSERT(result == expected);
	}

	uint8_t lo8[][2] = {
		{ 0, 0x00 },
		{ 3, 0x07 },
		{ 4, 0x0f },
		{ 7, 0x7f },
		{ 8, 0xff },
	};

	for (size_t i = 0; i < countof(lo8); i++) {
		uint8_t shift = lo8[i][0];
		uint8_t expected = lo8[i][1];
		uint8_t result = sl::getLoBitmask8(shift);
		printf("getLoBitmask8(%llu): 0x%08x\n", shift, result);
		TEST_ASSERT(result == expected);
	}

	uint8_t hi8[][2] = {
		{ 0, 0xff },
		{ 3, 0xf8 },
		{ 4, 0xf0 },
		{ 7, 0x80 },
		{ 8, 0x00 },
	};

	for (size_t i = 0; i < countof(hi8); i++) {
		uint64_t shift = hi8[i][0];
		uint64_t expected = hi8[i][1];
		uint64_t result = sl::getHiBitmask8(shift);
		printf("getHiBitmask8(%llu): 0x%08x\n", shift, result);
		TEST_ASSERT(result == expected);
	}
}